

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

bool __thiscall
helics::TimeCoordinator::transmitTimingMessages
          (TimeCoordinator *this,ActionMessage *msg,GlobalFederateId skipFed)

{
  int iVar1;
  pointer pDVar2;
  bool bVar3;
  bool bVar4;
  DependencyInfo *dep;
  pointer pDVar5;
  
  pDVar2 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar4 = false;
  for (pDVar5 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_start; pDVar5 != pDVar2; pDVar5 = pDVar5 + 1) {
    bVar3 = bVar4;
    if (pDVar5->dependent == true) {
      iVar1 = (pDVar5->fedID).gid;
      bVar3 = true;
      if (iVar1 != skipFed.gid) {
        (msg->dest_id).gid = iVar1;
        if ((msg->messageAction == cmd_time_request) || (msg->messageAction == cmd_exec_request)) {
          (msg->source_handle).hid = (pDVar5->super_TimeData).sequenceCounter;
        }
        std::function<void_(const_helics::ActionMessage_&)>::operator()
                  (&(this->super_BaseTimeCoordinator).sendMessageFunction,msg);
        bVar3 = bVar4;
      }
    }
    bVar4 = bVar3;
  }
  return bVar4;
}

Assistant:

bool TimeCoordinator::transmitTimingMessages(ActionMessage& msg, GlobalFederateId skipFed) const
{
    bool skipped{false};
    for (const auto& dep : dependencies) {
        if (dep.dependent) {
            if (dep.fedID == skipFed) {
                skipped = true;
                continue;
            }
            msg.dest_id = dep.fedID;
            if (msg.action() == CMD_EXEC_REQUEST || msg.action() == CMD_TIME_REQUEST) {
                msg.setExtraDestData(dep.sequenceCounter);
            }
            sendMessageFunction(msg);
        }
    }
    return skipped;
}